

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFetchXop(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size)

{
  ND_SIZET Size_local;
  ND_UINT8 Offset_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  if (Size < (ulong)Offset + 2) {
    return 0x80000001;
  }
  if (7 < (Code[(int)(Offset + 1)] & 0x1f)) {
    if (Size < (ulong)Offset + 3) {
      return 0x80000001;
    }
    if (((((*(uint *)&Instrux->field_0x5 >> 5 & 1) != 0) ||
         ((*(uint *)&Instrux->field_0x5 >> 8 & 1) != 0)) ||
        ((*(uint *)&Instrux->field_0x5 >> 9 & 1) != 0)) ||
       (((*(uint *)&Instrux->field_0x5 & 1) != 0 || ((*(uint *)&Instrux->field_0x5 >> 1 & 1) != 0)))
       ) {
      return 0x80000006;
    }
    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xfffffff7 | 8;
    *(uint *)Instrux = *(uint *)Instrux & 0xfff0ffff | 0x10000;
    (Instrux->field_73).Rex = *(ND_REX *)(Code + Offset);
    *(ND_UINT8 *)((long)&Instrux->field_73 + 1) = Code[(int)(Offset + 1)];
    *(ND_UINT8 *)((long)&Instrux->field_73 + 2) = Code[(int)(Offset + 2)];
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfffffffe |
                   (uint)(byte)((ushort)*(undefined2 *)((long)&Instrux->field_73 + 1) >> 0xf));
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfffffffd |
                   (((byte)(*(ushort *)((long)&Instrux->field_73 + 1) >> 7) & 1 ^ 0xffffffff) & 1)
                   << 1);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfffffffb |
                   (((byte)(*(ushort *)((long)&Instrux->field_73 + 1) >> 6) & 1 ^ 0xffffffff) & 1)
                   << 2);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfffffff7 |
                   (((byte)(*(ushort *)((long)&Instrux->field_73 + 1) >> 5) & 1 ^ 0xffffffff) & 1)
                   << 3);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xffff3fff |
                   (uint)((byte)((ushort)*(undefined2 *)((long)&Instrux->field_73 + 1) >> 10) & 1)
                   << 0xe);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfff0ffff |
                   (((byte)((ushort)*(undefined2 *)((long)&Instrux->field_73 + 1) >> 0xb) & 0xf ^
                    0xffffffff) & 0xf) << 0x10);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xffffc1ff |
                   (uint)((byte)*(undefined2 *)((long)&Instrux->field_73 + 1) & 0x1f) << 9);
    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                   ((uint)Instrux->Exs & 0xfffffe7f |
                   (uint)((byte)((ushort)*(undefined2 *)((long)&Instrux->field_73 + 1) >> 8) & 3) <<
                   7);
    if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x2) {
      if (((uint)Instrux->Exs >> 1 & 1 | (uint)Instrux->Exs >> 2 & 1) == 1) {
        return 0x80000009;
      }
      if (((uint)Instrux->Exs >> 0x10 & 8) == 8) {
        return 0x80000009;
      }
      Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)((uint)Instrux->Exs & 0xfffffff7);
    }
    Instrux->Length = Instrux->Length + '\x03';
    if (0xf < Instrux->Length) {
      return 0x80000003;
    }
  }
  return 0;
}

Assistant:

static NDSTATUS
NdFetchXop(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size
    )
{
    // Offset points to the 0x8F XOP prefix.
    // One more byte has to follow, the modrm or the second XOP byte.
    RET_GT((ND_SIZET)Offset + 2, Size, ND_STATUS_BUFFER_TOO_SMALL);

    if (((Code[Offset + 1] & 0x1F) >= 8))
    {
        // XOP found, make sure the third byte is here.
        RET_GT((ND_SIZET)Offset + 3, Size, ND_STATUS_BUFFER_TOO_SMALL);

        // Make sure we don't have any other prefix.
        if (Instrux->HasOpSize || 
            Instrux->HasRepnzXacquireBnd || 
            Instrux->HasRepRepzXrelease || 
            Instrux->HasRex || 
            Instrux->HasRex2)
        {
            return ND_STATUS_XOP_WITH_PREFIX;
        }

        // Fill in XOP info.
        Instrux->HasXop = ND_TRUE;
        Instrux->EncMode = ND_ENCM_XOP;
        Instrux->Xop.Xop[0] = Code[Offset];
        Instrux->Xop.Xop[1] = Code[Offset + 1];
        Instrux->Xop.Xop[2] = Code[Offset + 2];

        Instrux->Exs.w = Instrux->Xop.w;
        Instrux->Exs.r = (ND_UINT32)~Instrux->Xop.r;
        Instrux->Exs.x = (ND_UINT32)~Instrux->Xop.x;
        Instrux->Exs.b = (ND_UINT32)~Instrux->Xop.b;
        Instrux->Exs.l = Instrux->Xop.l;
        Instrux->Exs.v = (ND_UINT32)~Instrux->Xop.v;
        Instrux->Exs.m = Instrux->Xop.m;
        Instrux->Exs.p = Instrux->Xop.p;

        // if we are in non 64 bit mode, we must make sure that none of the extended registers are being addressed.
        if (Instrux->DefCode != ND_CODE_64)
        {
            // Xop.R and Xop.X must be 1 (inverted).
            if ((Instrux->Exs.r | Instrux->Exs.x) == 1)
            {
                return ND_STATUS_INVALID_ENCODING_IN_MODE;
            }

            // Xop.V must be less than 8.
            if ((Instrux->Exs.v & 0x8) == 0x8)
            {
                return ND_STATUS_INVALID_ENCODING_IN_MODE;
            }

            // Xop.B is ignored, so we force it to 0.
            Instrux->Exs.b = 0;
        }

        // Update Instrux length & offset, and make sure we don't exceed 15 bytes.
        Instrux->Length += 3;
        if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
        {
            return ND_STATUS_INSTRUCTION_TOO_LONG;
        }
    }

    return ND_STATUS_SUCCESS;
}